

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O0

bool aedit_name(CHAR_DATA *ch,char *argument)

{
  char *pcVar1;
  CHAR_DATA *in_RSI;
  char *in_RDI;
  bool bVar2;
  AREA_DATA_conflict *pArea;
  char *pstr;
  
  pstr = *(char **)(*(long *)(in_RDI + 0x80) + 0x6c60);
  bVar2 = *(char *)&in_RSI->next != '\0';
  if (bVar2) {
    free_pstring(pstr);
    pcVar1 = palloc_string((char *)pArea);
    *(char **)(pstr + 0x40) = pcVar1;
    send_to_char(in_RDI,in_RSI);
  }
  else {
    send_to_char(in_RDI,in_RSI);
  }
  return bVar2;
}

Assistant:

bool aedit_name(CHAR_DATA *ch, char *argument)
{
	AREA_DATA *pArea;

	EDIT_AREA(ch, pArea);

	if (argument[0] == '\0')
	{
		send_to_char("Syntax:   name [$name]\n\r", ch);
		return false;
	}

	free_pstring(pArea->name);
	pArea->name = palloc_string(argument);

	send_to_char("Name set.\n\r", ch);
	return true;
}